

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

int zt_unit_run_by_name(zt_unit *unit,char *name)

{
  int iVar1;
  char **ppcVar2;
  zt_unit_test *pzVar3;
  zt_unit_test *pzVar4;
  zt_unit_suite *pzVar5;
  zt_unit_suite *pzVar6;
  char *in_RSI;
  zt_unit_suite *in_RDI;
  size_t len;
  int result;
  zt_elist_t *tmp;
  zt_unit_test *unit_test;
  zt_unit_suite *unit_suite;
  char **targetv;
  int count;
  zt_unit_test *in_stack_ffffffffffffffb0;
  zt_unit_test *__n;
  zt_unit_suite *pzVar7;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar8;
  zt_unit *pzVar9;
  zt_unit *unit_00;
  zt_unit_suite *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  unit_00 = (zt_unit *)0x0;
  iVar8 = 0;
  ppcVar2 = str_split((char *)in_RDI,in_RSI,
                      (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if ((in_stack_ffffffffffffffec < 1) || (2 < in_stack_ffffffffffffffec)) {
    iVar8 = -1;
  }
  else {
    pzVar3 = (zt_unit_test *)strlen(*ppcVar2);
    pzVar5 = (zt_unit_suite *)(in_RDI->suite).next;
    while ((local_28 = (zt_unit_suite *)0x0, pzVar7 = pzVar5, pzVar5 != in_RDI &&
           ((__n = pzVar3, pzVar4 = (zt_unit_test *)strlen(pzVar5->name), pzVar3 != pzVar4 ||
            (iVar1 = strncmp(pzVar5->name,*ppcVar2,(size_t)__n), in_stack_ffffffffffffffb0 = pzVar3,
            local_28 = pzVar5, iVar1 != 0))))) {
      pzVar5 = (zt_unit_suite *)(pzVar7->suite).next;
      in_stack_ffffffffffffffb0 = pzVar3;
      pzVar3 = __n;
    }
    if (local_28 == (zt_unit_suite *)0x0) {
      iVar8 = -1;
    }
    else if (in_stack_ffffffffffffffec == 1) {
      iVar8 = zt_unit_run_suite(unit_00,pzVar7);
    }
    else {
      pzVar5 = (zt_unit_suite *)strlen(ppcVar2[1]);
      pzVar9 = (zt_unit *)(local_28->tests).next;
      while ((pzVar7 = pzVar5, pzVar9 != (zt_unit *)&local_28->tests &&
             ((unit_00 = pzVar9, pzVar6 = (zt_unit_suite *)strlen(*(char **)&pzVar9->suite_count),
              pzVar5 != pzVar6 ||
              (iVar1 = strncmp(*(char **)&unit_00->suite_count,ppcVar2[1],(size_t)pzVar7),
              iVar1 != 0))))) {
        unit_00 = (zt_unit *)0x0;
        pzVar9 = (zt_unit *)(pzVar9->suites).next;
        pzVar5 = pzVar7;
      }
      if (unit_00 == (zt_unit *)0x0) {
        iVar8 = -1;
      }
      else {
        iVar1 = zt_unit_run_test((zt_unit *)CONCAT44(iVar8,in_stack_ffffffffffffffc0),pzVar7,
                                 in_stack_ffffffffffffffb0);
        if (iVar1 == 0) {
          *(int *)((long)&(in_RDI->tests).next + 4) = *(int *)((long)&(in_RDI->tests).next + 4) + 1;
        }
        else {
          *(int *)&(in_RDI->tests).next = *(int *)&(in_RDI->tests).next + 1;
        }
      }
    }
  }
  str_split_free((char ***)0x1049b1);
  return iVar8;
}

Assistant:

int
zt_unit_run_by_name(struct zt_unit    * unit,
                    char    * name)
{
    int                    count;
    char                 **targetv;
    struct zt_unit_suite * unit_suite = NULL;
    struct zt_unit_test  * unit_test = NULL;
    zt_elist_t           * tmp;
    int                    result = 0;
    size_t                 len;

    targetv = str_split(name, ".", &count);

    if (count <= 0 || count > 2) {
        result = -1;
        goto done;
    }

    len = strlen(targetv[0]);
    zt_elist_for_each(&unit->suites, tmp) {
        unit_suite = zt_elist_data(tmp, struct zt_unit_suite, suite);
        if (len == strlen(unit_suite->name)) {
            if (strncmp(unit_suite->name, targetv[0], len) == 0) {
                break;
            }
        }
        unit_suite = NULL;
    }

    if (unit_suite == NULL) {
        result = -1;
        goto done;
    }

    if (count == 1) {
        result = zt_unit_run_suite(unit, unit_suite);
        goto done;
    }

    len = strlen(targetv[1]);
    zt_elist_for_each(&unit_suite->tests, tmp) {
        unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
        if (len == strlen(unit_test->name)) {
            if (strncmp(unit_test->name, targetv[1], len) == 0) {
                break;
            }
        }
        unit_test = NULL;
    }

    if (unit_test == NULL) {
        result = -1;
        goto done;
    }

    if (zt_unit_run_test(unit, unit_suite, unit_test) == FALSE) {
        unit->failures += 1;
    } else {
        unit->successes += 1;
    }

done:
    str_split_free(&targetv);
    return result;
}